

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.cpp
# Opt level: O0

int __thiscall JsonTest::Runner::runCommandLine(Runner *this,int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  long in_RDX;
  int in_ESI;
  Runner *in_RDI;
  bool in_stack_00000027;
  Runner *in_stack_00000028;
  bool succeeded;
  uint testNameIndex;
  string opt;
  int index;
  Runner subrunner;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  uint *indexOut;
  string *testName;
  undefined6 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff26;
  allocator in_stack_ffffffffffffff27;
  string local_d8 [40];
  int local_b0;
  undefined1 local_99 [37];
  int local_74;
  long local_20;
  int local_14;
  uint local_4;
  
  local_20 = in_RDX;
  local_14 = in_ESI;
  Runner((Runner *)0x13da08);
  for (local_74 = 1; local_74 < local_14; local_74 = local_74 + 1) {
    indexOut = *(uint **)(local_20 + (long)local_74 * 8);
    testName = (string *)local_99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_99 + 1),(char *)indexOut,(allocator *)testName);
    std::allocator<char>::~allocator((allocator<char> *)local_99);
    bVar2 = std::operator==(in_stack_fffffffffffffee0,
                            (char *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
    if (bVar2) {
      listTests((Runner *)
                CONCAT17(in_stack_ffffffffffffff27,
                         CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
      local_4 = 0;
      local_b0 = 1;
    }
    else {
      bVar2 = std::operator==(in_stack_fffffffffffffee0,
                              (char *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8))
      ;
      if (bVar2) {
        preventDialogOnCrash();
LAB_0013dce1:
        local_b0 = 0;
      }
      else {
        bVar2 = std::operator==(in_stack_fffffffffffffee0,
                                (char *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8
                                                ));
        if (bVar2) {
          local_74 = local_74 + 1;
          if (local_74 < local_14) {
            pcVar1 = *(char **)(local_20 + (long)local_74 * 8);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_d8,pcVar1,(allocator *)&stack0xffffffffffffff27);
            bVar2 = testIndex(in_RDI,testName,indexOut);
            std::__cxx11::string::~string(local_d8);
            std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff27);
            if (bVar2) {
              std::deque<JsonTest::TestCase_*(*)(),_std::allocator<JsonTest::TestCase_*(*)()>_>::
              operator[]((deque<JsonTest::TestCase_*(*)(),_std::allocator<JsonTest::TestCase_*(*)()>_>
                          *)in_stack_fffffffffffffee0,
                         CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
              add((Runner *)in_stack_fffffffffffffee0,
                  (TestCaseFactory)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
              goto LAB_0013dce1;
            }
            fprintf(_stderr,"Test \'%s\' does not exist!\n",
                    *(undefined8 *)(local_20 + (long)local_74 * 8));
            local_4 = 2;
            local_b0 = 1;
          }
          else {
            printUsage((char *)0x13dc9f);
            local_4 = 2;
            local_b0 = 1;
          }
        }
        else {
          printUsage((char *)0x13dcc8);
          local_4 = 2;
          local_b0 = 1;
        }
      }
    }
    std::__cxx11::string::~string((string *)(local_99 + 1));
    if (local_b0 != 0) goto LAB_0013ddcb;
  }
  uVar3 = testCount((Runner *)0x13dd3d);
  if (uVar3 == 0) {
    bVar2 = runAllTest(in_stack_00000028,in_stack_00000027);
  }
  else {
    testCount((Runner *)0x13dd54);
    bVar2 = runAllTest(in_stack_00000028,in_stack_00000027);
  }
  local_4 = (uint)(bVar2 == false);
  local_b0 = 1;
LAB_0013ddcb:
  ~Runner((Runner *)0x13ddd8);
  return local_4;
}

Assistant:

int Runner::runCommandLine(int argc, const char* argv[]) const {
  // typedef std::deque<std::string> TestNames;
  Runner subrunner;
  for (int index = 1; index < argc; ++index) {
    std::string opt = argv[index];
    if (opt == "--list-tests") {
      listTests();
      return 0;
    } else if (opt == "--test-auto") {
      preventDialogOnCrash();
    } else if (opt == "--test") {
      ++index;
      if (index < argc) {
        unsigned int testNameIndex;
        if (testIndex(argv[index], testNameIndex)) {
          subrunner.add(tests_[testNameIndex]);
        } else {
          fprintf(stderr, "Test '%s' does not exist!\n", argv[index]);
          return 2;
        }
      } else {
        printUsage(argv[0]);
        return 2;
      }
    } else {
      printUsage(argv[0]);
      return 2;
    }
  }
  bool succeeded;
  if (subrunner.testCount() > 0) {
    succeeded = subrunner.runAllTest(subrunner.testCount() > 1);
  } else {
    succeeded = runAllTest(true);
  }
  return succeeded ? 0 : 1;
}